

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MedianFilterCV_8U.cpp
# Opt level: O0

uchar __thiscall MedianFilterCV_8U::getMedian(MedianFilterCV_8U *this,Mat *param_1,int y,int x)

{
  uchar uVar1;
  uchar local_26 [6];
  int iStack_20;
  uchar mergeResult [6];
  int x_local;
  int y_local;
  Mat *param_1_local;
  MedianFilterCV_8U *this_local;
  
  iStack_20 = x;
  mergeResult._2_4_ = y;
  initThreeAdjacentPixels(this,this->sourceImage,this->firstTempArray,y + -1,x,true);
  initThreeAdjacentPixels
            (this,this->sourceImage,this->secondTempArray,mergeResult._2_4_,iStack_20,true);
  initThreeAdjacentPixels
            (this,this->sourceImage,this->thirdTempArray,mergeResult._2_4_ + 1,iStack_20,true);
  sortThreeElements(this,this->firstTempArray);
  sortThreeElements(this,this->secondTempArray);
  sortThreeElements(this,this->thirdTempArray);
  mergeTwoSortedArray(this,this->firstTempArray,3,this->secondTempArray,3,local_26);
  uVar1 = getMedianOfTwoSortedArray(this,local_26,6,this->thirdTempArray,3);
  return uVar1;
}

Assistant:

uchar MedianFilterCV_8U::getMedian(const cv::Mat &, int y, int x) {
    initThreeAdjacentPixels(*sourceImage, firstTempArray, y - 1, x, true);
    initThreeAdjacentPixels(*sourceImage, secondTempArray, y, x, true);
    initThreeAdjacentPixels(*sourceImage, thirdTempArray, y + 1, x, true);

    sortThreeElements(firstTempArray);
    sortThreeElements(secondTempArray);
    sortThreeElements(thirdTempArray);

    uchar mergeResult[6];
    mergeTwoSortedArray(firstTempArray, 3, secondTempArray, 3, mergeResult);

    return getMedianOfTwoSortedArray(mergeResult, 6, thirdTempArray, 3);
}